

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.h
# Opt level: O1

void __thiscall embree::FileStream::~FileStream(FileStream *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  
  (this->super_Stream<int>).super_RefCount._vptr_RefCount = (_func_int **)&PTR__FileStream_002ca638;
  if (((&this->field_0x60)[*(long *)(*(long *)&this->ifs + -0x18)] & 5) == 0) {
    std::ifstream::close();
  }
  this_00 = (this->name).
            super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  std::ifstream::~ifstream(&this->ifs);
  (this->super_Stream<int>).super_RefCount._vptr_RefCount = (_func_int **)&PTR__Stream_002ca5f8;
  std::
  vector<std::pair<int,_embree::ParseLocation>,_std::allocator<std::pair<int,_embree::ParseLocation>_>_>
  ::~vector(&(this->super_Stream<int>).buffer);
  return;
}

Assistant:

~FileStream() { 
      if (ifs) ifs.close();
    }